

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O1

Vec_Int_t * Mio_SopCoverOr(Vec_Int_t *p,Vec_Int_t *q)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = p->nSize;
  iVar2 = q->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < (iVar2 + iVar1) - 1U) {
    iVar4 = iVar2 + iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar3;
  if (0 < p->nSize) {
    lVar5 = 0;
    do {
      Vec_IntPush(p_00,p->pArray[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->nSize);
  }
  if (0 < q->nSize) {
    lVar5 = 0;
    do {
      Mio_SopPushSCC(p_00,q->pArray[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < q->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Mio_SopCoverOr( Vec_Int_t * p, Vec_Int_t * q )
{
    Vec_Int_t * r;
    unsigned Entry;
    int i;
    r = Vec_IntAlloc( Vec_IntSize(p) + Vec_IntSize(q) );
    Vec_IntForEachEntry( p, Entry, i )
        Vec_IntPush( r, Entry );
    Vec_IntForEachEntry( q, Entry, i )
        Mio_SopPushSCC( r, Entry );
    return r;
}